

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::InnerMap::~InnerMap(InnerMap *this)

{
  Arena *pAVar1;
  InnerMap *this_local;
  
  pAVar1 = internal::MapAllocator<void_*>::arena(&this->alloc_);
  if ((pAVar1 == (Arena *)0x0) && (this->num_buckets_ != 1)) {
    clear(this);
    Map<std::__cxx11::string,CoreML::Specification::CustomLayerParams_CustomLayerParamValue>::
    InnerMap::Dealloc<void*>((InnerMap *)this,this->table_,this->num_buckets_);
  }
  return;
}

Assistant:

~InnerMap() {
      if (alloc_.arena() == nullptr &&
          num_buckets_ != internal::kGlobalEmptyTableSize) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }